

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O0

void __thiscall
LRGrammaticalAnalyzer::PrintStack
          (LRGrammaticalAnalyzer *this,vector<quadraple,_std::allocator<quadraple>_> *token,int pos,
          stack<int,_std::deque<int,_std::allocator<int>_>_> *stateid,
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *symbol)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference __lhs;
  ostream *poVar6;
  long local_328;
  ofstream analyzeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  int local_e4;
  undefined1 local_e0 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_90 [8];
  string sym;
  string tk;
  string st;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *symbol_local;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *stateid_local;
  int pos_local;
  vector<quadraple,_std::allocator<quadraple>_> *token_local;
  LRGrammaticalAnalyzer *this_local;
  
  std::__cxx11::string::string((string *)(tk.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sym.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_90);
  while (bVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty(stateid),
        local_e4 = pos, ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(stateid);
    std::__cxx11::to_string((string *)local_e0,*pvVar2);
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0," "
                  );
    std::__cxx11::string::operator+=((string *)(tk.field_2._M_local_buf + 8),(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_e0);
    std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop(stateid);
  }
  for (; uVar3 = (ulong)local_e4,
      sVar4 = std::vector<quadraple,_std::allocator<quadraple>_>::size(token), uVar3 < sVar4;
      local_e4 = local_e4 + 1) {
    pvVar5 = std::vector<quadraple,_std::allocator<quadraple>_>::operator[](token,(long)local_e4);
    std::operator+(&local_108,&pvVar5->attributevalue," ");
    std::__cxx11::string::operator+=((string *)(sym.field_2._M_local_buf + 8),(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  while (bVar1 = std::
                 stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::empty(symbol), ((bVar1 ^ 0xffU) & 1) != 0) {
    __lhs = std::
            stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::top(symbol);
    std::operator+(&local_128,__lhs," ");
    std::__cxx11::string::operator+=(local_90,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop(symbol);
  }
  std::ofstream::ofstream(&local_328,"AnalyzeProcess.txt",_S_app);
  std::ios_base::setf((ios_base *)((long)&local_328 + *(long *)(local_328 + -0x18)),_S_left);
  std::ios_base::width((ios_base *)((long)&local_328 + *(long *)(local_328 + -0x18)),0x2d);
  poVar6 = std::operator<<((ostream *)&local_328,(string *)(tk.field_2._M_local_buf + 8));
  std::operator<<(poVar6,'|');
  std::ios_base::width((ios_base *)((long)&local_328 + *(long *)(local_328 + -0x18)),0x28);
  poVar6 = std::operator<<((ostream *)&local_328,(string *)(sym.field_2._M_local_buf + 8));
  std::operator<<(poVar6,'|');
  std::ios_base::width((ios_base *)((long)&local_328 + *(long *)(local_328 + -0x18)),0x96);
  poVar6 = std::operator<<((ostream *)&local_328,local_90);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(&local_328);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(sym.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(tk.field_2._M_local_buf + 8));
  return;
}

Assistant:

void LRGrammaticalAnalyzer::PrintStack(std::vector<quadraple> &token, int pos, std::stack<int> stateid,
                                       std::stack<std::string> symbol) {

    std::string st, tk, sym;
    while (!stateid.empty()) {
        //std::cout << stateid.top()<<' ';
        st += std::to_string(stateid.top()) + " ";
        stateid.pop();
    }


    for (int i = pos; i < token.size(); i++)
        //std::cout << token[i].attributevalue << ' ';
        tk += token[i].attributevalue + " ";


    while (!symbol.empty()) {
        //std::cout << symbol.top()<<" ";
        sym += symbol.top() + " ";
        symbol.pop();
    }

    std::ofstream analyzeout("AnalyzeProcess.txt", std::ofstream::app);

    analyzeout.setf(std::ios::left);
    analyzeout.width(45);
    analyzeout << st << '|';
    analyzeout.width(40);
    analyzeout << tk << '|';
    analyzeout.width(150);
    analyzeout << sym << std::endl;

    analyzeout.close();
}